

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall ParseUint128_Basic_Test::TestBody(ParseUint128_Basic_Test *this)

{
  char *in_RCX;
  v128 expected;
  v128 expected_00;
  v128 expected_01;
  
  anon_unknown.dwarf_7da04::AssertUint128Equals
            ((anon_unknown_dwarf_7da04 *)0x0,(v128)(ZEXT816(0x1de6a3) << 0x40),in_RCX);
  anon_unknown.dwarf_7da04::AssertUint128Equals
            ((anon_unknown_dwarf_7da04 *)0x1,(v128)(ZEXT816(0x1caef8) << 0x40),in_RCX);
  expected.v._8_8_ = "5332529520247008778714484145835150861";
  expected.v[0] = '\x05';
  expected.v[1] = '\x06';
  expected.v[2] = '\a';
  expected.v[3] = '\b';
  expected.v[4] = '\x01';
  expected.v[5] = '\x02';
  expected.v[6] = '\x03';
  expected.v[7] = '\x04';
  anon_unknown.dwarf_7da04::AssertUint128Equals
            ((anon_unknown_dwarf_7da04 *)0xc0b0a09100f0e0d,expected,in_RCX);
  expected_00.v._8_8_ = "340282366920938463463374607431768211455";
  expected_00.v[0] = 0xff;
  expected_00.v[1] = 0xff;
  expected_00.v[2] = 0xff;
  expected_00.v[3] = 0xff;
  expected_00.v[4] = 0xff;
  expected_00.v[5] = 0xff;
  expected_00.v[6] = 0xff;
  expected_00.v[7] = 0xff;
  anon_unknown.dwarf_7da04::AssertUint128Equals
            ((anon_unknown_dwarf_7da04 *)0xffffffffffffffff,expected_00,in_RCX);
  expected_01.v._8_8_ = "18446744073709551616";
  expected_01.v[0] = '\x01';
  expected_01.v[1] = '\0';
  expected_01.v[2] = '\0';
  expected_01.v[3] = '\0';
  expected_01.v[4] = '\0';
  expected_01.v[5] = '\0';
  expected_01.v[6] = '\0';
  expected_01.v[7] = '\0';
  anon_unknown.dwarf_7da04::AssertUint128Equals((anon_unknown_dwarf_7da04 *)0x0,expected_01,in_RCX);
  return;
}

Assistant:

TEST(ParseUint128, Basic) {
  AssertUint128Equals({0, 0, 0, 0}, "0");
  AssertUint128Equals({1, 0, 0, 0}, "1");
  AssertUint128Equals({0x100f0e0d, 0x0c0b0a09, 0x08070605, 0x04030201},
                      "5332529520247008778714484145835150861");
  AssertUint128Equals({0xffffffff, 0xffffffff, 0xffffffff, 0xffffffff},
                      "340282366920938463463374607431768211455");
  AssertUint128Equals({0, 0, 1, 0}, "18446744073709551616");
}